

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slaveinfo.c
# Opt level: O3

int si_PDOassign(uint16 slave,uint16 PDOassign,int mapoffset,int bitoffset)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  undefined6 in_register_00000032;
  undefined6 in_register_0000003a;
  uint uVar4;
  uint uVar5;
  int iVar6;
  short sVar7;
  uint8 subcnt;
  int rdl;
  byte local_5f;
  ushort local_5e;
  undefined4 local_5c;
  ushort local_56;
  uint local_54;
  int local_50;
  undefined4 local_4c;
  uint local_48;
  uint local_44;
  int local_40;
  int local_3c;
  uint local_38;
  uint local_34;
  
  local_5c = 2;
  local_5e = 0;
  iVar6 = 0;
  local_3c = mapoffset;
  uVar1 = ec_SDOread(CONCAT62(in_register_0000003a,slave),CONCAT62(in_register_00000032,PDOassign),0
                     ,0,&local_5c,&local_5e,700000);
  local_56 = local_5e;
  if (local_5e != 0 && 0 < (int)uVar1) {
    uVar2 = CONCAT62((int6)((ulong)uVar1 >> 0x10),1);
    uVar3 = (uint)slave;
    local_44 = (uint)PDOassign;
    local_54 = (uint)slave;
    iVar6 = 0;
    do {
      local_5c = 2;
      local_5e = 0;
      local_40 = (int)uVar2;
      ec_SDOread(uVar3,local_44,uVar2 & 0xff,0,&local_5c,&local_5e,700000);
      if (local_5e != 0) {
        local_5c = 1;
        local_5f = 0;
        local_34 = (uint)local_5e;
        ec_SDOread(uVar3,local_5e,0,0,&local_5c,&local_5f,700000);
        local_38 = (uint)local_5f;
        if (local_5f != 0) {
          sVar7 = 0;
          do {
            local_5c = 4;
            local_48 = 0;
            local_4c = 0;
            local_50 = iVar6;
            ec_SDOread(uVar3,local_34,sVar7 + 1U & 0xff,0,&local_5c,&local_48,700000);
            uVar4 = local_48;
            uVar5 = local_48 >> 0x10;
            iVar6 = bitoffset + 7;
            if (-1 < bitoffset) {
              iVar6 = bitoffset;
            }
            ODlist.Slave = (uint16)uVar3;
            ODlist.Index[0] = (uint16)(local_48 >> 0x10);
            OElist.Entries = 0;
            uVar3 = local_48 >> 8 & 0xff;
            if (0xffff < local_48 || uVar3 != 0) {
              uVar1 = ec_readOEsingle(0,local_48 >> 8 & 0xff,&ODlist,&OElist);
              local_4c = (undefined4)CONCAT71((int7)((ulong)uVar1 >> 8),0 < (int)uVar1);
            }
            uVar4 = uVar4 & 0xff;
            printf("  [0x%4.4X.%1d] 0x%4.4X:0x%2.2X 0x%2.2X",(ulong)(uint)((iVar6 >> 3) + local_3c),
                   (ulong)(uint)(bitoffset % 8),(ulong)uVar5,(ulong)uVar3,(ulong)uVar4);
            if (((char)local_4c == '\0') || (OElist.Entries == 0)) {
              putchar(10);
            }
            else {
              dtype2string(OElist.DataType[uVar3]);
              printf(" %-12s %s\n",hstr,(ulong)uVar3 * 0x29 + 0x112896);
            }
            iVar6 = local_50 + uVar4;
            bitoffset = bitoffset + uVar4;
            sVar7 = sVar7 + 1;
            uVar3 = local_54;
          } while ((short)local_38 != sVar7);
        }
      }
      uVar2 = (ulong)(local_40 + 1U);
    } while ((ushort)(local_40 + 1U) <= local_56);
  }
  return iVar6;
}

Assistant:

int si_PDOassign(uint16 slave, uint16 PDOassign, int mapoffset, int bitoffset)
{
    uint16 idxloop, nidx, subidxloop, rdat, idx, subidx;
    uint8 subcnt;
    int wkc, bsize = 0, rdl;
    int32 rdat2;
    uint8 bitlen, obj_subidx;
    uint16 obj_idx;
    int abs_offset, abs_bit;

    rdl = sizeof(rdat); rdat = 0;
    /* read PDO assign subindex 0 ( = number of PDO's) */
    wkc = ec_SDOread(slave, PDOassign, 0x00, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
    rdat = etohs(rdat);
    /* positive result from slave ? */
    if ((wkc > 0) && (rdat > 0))
    {
        /* number of available sub indexes */
        nidx = rdat;
        bsize = 0;
        /* read all PDO's */
        for (idxloop = 1; idxloop <= nidx; idxloop++)
        {
            rdl = sizeof(rdat); rdat = 0;
            /* read PDO assign */
            wkc = ec_SDOread(slave, PDOassign, (uint8)idxloop, FALSE, &rdl, &rdat, EC_TIMEOUTRXM);
            /* result is index of PDO */
            idx = etohl(rdat);
            if (idx > 0)
            {
                rdl = sizeof(subcnt); subcnt = 0;
                /* read number of subindexes of PDO */
                wkc = ec_SDOread(slave,idx, 0x00, FALSE, &rdl, &subcnt, EC_TIMEOUTRXM);
                subidx = subcnt;
                /* for each subindex */
                for (subidxloop = 1; subidxloop <= subidx; subidxloop++)
                {
                    rdl = sizeof(rdat2); rdat2 = 0;
                    /* read SDO that is mapped in PDO */
                    wkc = ec_SDOread(slave, idx, (uint8)subidxloop, FALSE, &rdl, &rdat2, EC_TIMEOUTRXM);
                    rdat2 = etohl(rdat2);
                    /* extract bitlength of SDO */
                    bitlen = LO_BYTE(rdat2);
                    bsize += bitlen;
                    obj_idx = (uint16)(rdat2 >> 16);
                    obj_subidx = (uint8)((rdat2 >> 8) & 0x000000ff);
                    abs_offset = mapoffset + (bitoffset / 8);
                    abs_bit = bitoffset % 8;
                    ODlist.Slave = slave;
                    ODlist.Index[0] = obj_idx;
                    OElist.Entries = 0;
                    wkc = 0;
                    /* read object entry from dictionary if not a filler (0x0000:0x00) */
                    if(obj_idx || obj_subidx)
                        wkc = ec_readOEsingle(0, obj_subidx, &ODlist, &OElist);
                    printf("  [0x%4.4X.%1d] 0x%4.4X:0x%2.2X 0x%2.2X", abs_offset, abs_bit, obj_idx, obj_subidx, bitlen);
                    if((wkc > 0) && OElist.Entries)
                    {
                        printf(" %-12s %s\n", dtype2string(OElist.DataType[obj_subidx]), OElist.Name[obj_subidx]);
                    }
                    else
                        printf("\n");
                    bitoffset += bitlen;
                };
            };
        };
    };
    /* return total found bitlength (PDO) */
    return bsize;
}